

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_assign(Curl_multi *multi,curl_socket_t s,void *hashp)

{
  CURLMcode CVar1;
  void *pvVar2;
  curl_socket_t local_c;
  
  CVar1 = CURLM_RECURSIVE_API_CALL;
  if (multi->in_callback == false) {
    if (s == -1) {
      pvVar2 = (void *)0x0;
    }
    else {
      local_c = s;
      pvVar2 = Curl_hash_pick(&multi->sockhash,&local_c,4);
    }
    if (pvVar2 == (void *)0x0) {
      CVar1 = CURLM_BAD_SOCKET;
    }
    else {
      *(void **)((long)pvVar2 + 0x10) = hashp;
      CVar1 = CURLM_OK;
    }
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_assign(struct Curl_multi *multi, curl_socket_t s,
                            void *hashp)
{
  struct Curl_sh_entry *there = NULL;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  there = sh_getentry(&multi->sockhash, s);

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}